

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  pointer *pppcVar1;
  cmCPackComponent *pcVar2;
  char *pcVar3;
  iterator iVar4;
  iterator __position;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  const_iterator cVar8;
  long *plVar9;
  char *pcVar10;
  size_t sVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type *psVar13;
  string *psVar14;
  _Alloc_hider _Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCPackComponent *component;
  string macroPrefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long local_70;
  size_type local_68;
  long lStack_60;
  string local_58;
  cmCPackComponentGroup *pcVar12;
  
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::find(&(this->Components)._M_t,name);
  local_80._M_allocated_capacity =
       (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if ((_Rb_tree_header *)cVar8._M_node == &(this->Components)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase((string *)local_a0,name);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x4fac33);
    local_80._8_8_ = &local_68;
    psVar13 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar13) {
      local_68 = *psVar13;
      lStack_60 = plVar9[3];
    }
    else {
      local_68 = *psVar13;
      local_80._8_8_ = (size_type *)*plVar9;
    }
    local_70 = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    pcVar2 = (cmCPackComponent *)(local_a0 + 0x10);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)local_80._M_allocated_capacity);
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
      std::__cxx11::string::_M_assign((string *)(local_80._M_allocated_capacity + 0x20));
    }
    else {
      pcVar3 = *(char **)(local_80._M_allocated_capacity + 0x28);
      psVar14 = (string *)(local_80._M_allocated_capacity + 0x20);
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar3,(ulong)pcVar10);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    bVar6 = cmSystemTools::IsOn(pcVar10);
    *(byte *)(local_80._M_allocated_capacity + 0x48) =
         *(byte *)(local_80._M_allocated_capacity + 0x48) & 0xfd | bVar6 * '\x02';
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    bVar6 = cmSystemTools::IsOn(pcVar10);
    *(byte *)(local_80._M_allocated_capacity + 0x48) =
         *(byte *)(local_80._M_allocated_capacity + 0x48) & 0xfe | bVar6;
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    bVar6 = cmSystemTools::IsOn(pcVar10);
    *(byte *)(local_80._M_allocated_capacity + 0x48) =
         *(byte *)(local_80._M_allocated_capacity + 0x48) & 0xfb | bVar6 << 2;
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    bVar6 = cmSystemTools::IsOn(pcVar10);
    if (bVar6) {
      *(byte *)(local_80._M_allocated_capacity + 0x48) =
           *(byte *)(local_80._M_allocated_capacity + 0x48) | 8;
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CPACK_DOWNLOAD_ALL","");
      pcVar10 = GetOption(this,&local_58);
      bVar6 = cmSystemTools::IsOn(pcVar10);
      *(byte *)(local_80._M_allocated_capacity + 0x48) =
           *(byte *)(local_80._M_allocated_capacity + 0x48) & 0xf7 | bVar6 << 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
      pcVar3 = *(char **)(local_80._M_allocated_capacity + 0x90);
      psVar14 = (string *)(local_80._M_allocated_capacity + 0x88);
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar3,(ulong)pcVar10);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
      *(cmCPackComponentGroup **)(local_80._M_allocated_capacity + 0x40) =
           (cmCPackComponentGroup *)0x0;
    }
    else {
      local_a0._0_8_ = pcVar2;
      sVar11 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar10,pcVar10 + sVar11);
      iVar7 = (*(this->super_cmObject)._vptr_cmObject[0x1b])(this,projectName,local_a0);
      pcVar12 = (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar7);
      *(cmCPackComponentGroup **)(local_80._M_allocated_capacity + 0x40) = pcVar12;
      if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        pcVar12 = *(cmCPackComponentGroup **)(local_80._M_allocated_capacity + 0x40);
      }
      iVar4._M_current =
           (pcVar12->Components).
           super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pcVar12->Components).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
        _M_realloc_insert<cmCPackComponent*const&>
                  ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                   &pcVar12->Components,iVar4,(cmCPackComponent **)&local_80._M_allocated_capacity);
      }
      else {
        *iVar4._M_current = (cmCPackComponent *)local_80._M_allocated_capacity;
        pppcVar1 = &(pcVar12->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
      pcVar3 = *(char **)(local_80._M_allocated_capacity + 0x58);
      psVar14 = (string *)(local_80._M_allocated_capacity + 0x50);
      strlen(pcVar10);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar3,(ulong)pcVar10);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      local_a0._0_8_ = pcVar2;
      sVar11 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar10,pcVar10 + sVar11);
      cmSystemTools::ExpandListArgument
                ((string *)local_a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,false);
      if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        _Var15._M_p = local_58._M_dataplus._M_p;
        do {
          uVar5 = local_80._M_allocated_capacity;
          iVar7 = (*(this->super_cmObject)._vptr_cmObject[0x19])(this,projectName,_Var15._M_p);
          local_a0._0_8_ = CONCAT44(extraout_var_00,iVar7);
          __position._M_current = *(pointer *)(uVar5 + 0x78);
          if (__position._M_current == *(pointer *)(uVar5 + 0x80)) {
            std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
            _M_realloc_insert<cmCPackInstallationType*>
                      ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                       (uVar5 + 0x70),__position,(cmCPackInstallationType **)local_a0);
          }
          else {
            *__position._M_current = (cmCPackInstallationType *)local_a0._0_8_;
            *(pointer *)(uVar5 + 0x78) = *(pointer *)(uVar5 + 0x78) + 1;
          }
          _Var15._M_p = _Var15._M_p + 0x20;
        } while (_Var15._M_p != (pointer)local_58._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
    local_a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._8_8_,local_70 + local_80._8_8_);
    std::__cxx11::string::append(local_a0);
    pcVar10 = GetOption(this,(string *)local_a0);
    if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      local_a0._0_8_ = pcVar2;
      sVar11 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar10,pcVar10 + sVar11);
      cmSystemTools::ExpandListArgument
                ((string *)local_a0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_58,false);
      if ((cmCPackComponent *)local_a0._0_8_ != pcVar2) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
        _Var15._M_p = local_58._M_dataplus._M_p;
        do {
          iVar7 = (*(this->super_cmObject)._vptr_cmObject[0x1a])(this,projectName,_Var15._M_p);
          local_a0._0_8_ = CONCAT44(extraout_var_01,iVar7);
          iVar4._M_current = *(pointer *)(local_80._M_allocated_capacity + 0xb0);
          if (iVar4._M_current == *(pointer *)(local_80._M_allocated_capacity + 0xb8)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_80._M_allocated_capacity + 0xa8),iVar4,(cmCPackComponent **)local_a0);
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_a0._0_8_;
            *(pointer *)(local_80._M_allocated_capacity + 0xb0) =
                 *(pointer *)(local_80._M_allocated_capacity + 0xb0) + 1;
          }
          iVar4._M_current = *(pointer *)(local_a0._0_8_ + 200);
          if (iVar4._M_current == *(pointer *)(local_a0._0_8_ + 0xd0)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_a0._0_8_ + 0xc0),iVar4,
                       (cmCPackComponent **)&local_80._M_allocated_capacity);
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_80._M_allocated_capacity;
            *(pointer *)(local_a0._0_8_ + 200) = *(pointer *)(local_a0._0_8_ + 200) + 1;
          }
          _Var15._M_p = _Var15._M_p + 0x20;
        } while (_Var15._M_p != (pointer)local_58._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
    }
    if ((size_type *)local_80._8_8_ != &local_68) {
      operator_delete((void *)local_80._8_8_,local_68 + 1);
    }
  }
  return (cmCPackComponent *)local_80._M_allocated_capacity;
}

Assistant:

cmCPackComponent*
cmCPackGenerator::GetComponent(const std::string& projectName,
                               const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent *component = &this->Components[name];
  if (!hasComponent)
    {
    // Define the component
    std::string macroPrefix = "CPACK_COMPONENT_"
      + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      component->DisplayName = displayName;
      }
    else
      {
      component->DisplayName = component->Name;
      }
    component->IsHidden
      = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired
      = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault
      = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded
      = this->IsOn(macroPrefix + "_DOWNLOADED")
        || cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix +
                                               "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile)
      {
      component->ArchiveFile = archiveFile;
      }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName)
      {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
      }
    else
      {
      component->Group = 0;
      }

    const char* description
      = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description)
      {
      component->Description = description;
      }

    // Determine the installation types.
    const char *installTypes
      = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes)
      {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      std::vector<std::string>::iterator installTypesIt;
      for (installTypesIt = installTypesVector.begin();
           installTypesIt != installTypesVector.end();
           ++installTypesIt)
        {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, *installTypesIt));
        }
      }

    // Determine the component dependencies.
    const char *depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends)
      {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      std::vector<std::string>::iterator dependIt;
      for (dependIt = dependsVector.begin();
           dependIt != dependsVector.end();
           ++dependIt)
        {
        cmCPackComponent *child = GetComponent(projectName,
                                               *dependIt);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
        }
      }
    }
  return component;
}